

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall
CLI::ValidationError::ValidationError
          (ValidationError *this,string *ValidationError,string *msg,ExitCodes exit_code)

{
  string sStack_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,(string *)ValidationError);
  ::std::__cxx11::string::string((string *)&sStack_68,(string *)msg);
  ParseError::ParseError(&this->super_ParseError,&local_48,&sStack_68,exit_code);
  ::std::__cxx11::string::~string((string *)&sStack_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__Error_0011aba0;
  return;
}

Assistant:

ValidationError(std::string name, std::string msg) : ValidationError(name + ": " + msg) {}